

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
* dgrminer::find_maximal_subsets_of_pairs
            (vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             *__return_storage_ptr__,
            vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
            *sets)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  pointer pvVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  pointer piVar7;
  pointer psVar8;
  undefined4 extraout_EDX;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  __normal_iterator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_*,_std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>
  __i;
  long lVar12;
  pointer pvVar13;
  ulong uVar14;
  _Self __tmp;
  ulong uVar15;
  ulong uVar16;
  size_t i_1;
  ulong uVar17;
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  vectors;
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  buckets;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  output;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  newbucked;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> currentSet;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  bucket;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  testBucket;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> testSet;
  
  output.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectors.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectors.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vectors.
  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar9 = 0;
      pvVar4 = vectors.
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pvVar1 = vectors.
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      psVar8 = (sets->
               super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(sets->
                             super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8) / 0x30);
      uVar9 = uVar9 + 1) {
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var6 = *(_Base_ptr *)((long)&psVar8[uVar9]._M_t._M_impl.super__Rb_tree_header + 0x10);
    while (p_Var6 != &psVar8[uVar9]._M_t._M_impl.super__Rb_tree_header._M_header) {
      std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::push_back
                ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&bucket,
                 (value_type *)(p_Var6 + 1));
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      psVar8 = (sets->
               super__Vector_base<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::push_back(&vectors,(value_type *)&bucket);
    std::_Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::~_Vector_base
              ((_Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&bucket);
  }
  lVar12 = (long)vectors.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vectors.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = lVar12 / 0x18;
  if (uVar9 < 2) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         vectors.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         vectors.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         vectors.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    vectors.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vectors.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vectors.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (vectors.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vectors.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                (vectors.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 vectors.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                  (pvVar1,pvVar4);
      }
      else {
        pvVar13 = pvVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                  (pvVar1,pvVar13);
        for (; pvVar13 != pvVar4; pvVar13 = pvVar13 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,__gnu_cxx::__ops::_Val_comp_iter<dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>>
                    (pvVar13);
        }
      }
    }
    uVar17 = (ulong)((long)((vectors.
                             super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)((vectors.
                            super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3;
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar12 = 0;
    for (uVar9 = 0;
        uVar9 < (ulong)(((long)vectors.
                               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vectors.
                              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar9 = uVar9 + 1)
    {
      uVar11 = *(long *)((long)&((vectors.
                                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                )._M_impl.super__Vector_impl_data._M_finish + lVar12) -
               *(long *)((long)&((vectors.
                                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar12) >> 3;
      if (uVar11 == (long)(int)uVar17) {
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::push_back(&bucket,(value_type *)
                            ((long)&((vectors.
                                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar12));
      }
      else {
        std::
        vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
        ::push_back(&buckets,&bucket);
        newbucked.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        newbucked.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        newbucked.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::operator=(&bucket,&newbucked);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::push_back(&bucket,(value_type *)
                            ((long)&((vectors.
                                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar12));
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::~vector(&newbucked);
        uVar17 = uVar11 & 0xffffffff;
      }
      lVar12 = lVar12 + 0x18;
    }
    std::
    vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
    ::push_back(&buckets,&bucket);
    lVar12 = 0;
    for (uVar9 = 0;
        pvVar1 = ((buckets.
                   super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)(((long)((buckets.
                                 super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
        uVar9 = uVar9 + 1) {
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(&output,(value_type *)
                          ((long)&(pvVar1->
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  )._M_impl.super__Vector_impl_data + lVar12));
      lVar12 = lVar12 + 0x18;
    }
    for (uVar9 = 1;
        uVar9 < (ulong)(((long)buckets.
                               super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)buckets.
                              super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar9 = uVar9 + 1)
    {
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::vector(&newbucked,
               buckets.
               super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar9);
      uVar17 = 0;
LAB_0011c350:
      if (uVar17 < (ulong)(((long)newbucked.
                                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)newbucked.
                                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                  (&currentSet,
                   newbucked.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        if (currentSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            currentSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          bVar3 = true;
          uVar11 = 0;
LAB_0011c39e:
          if (uVar11 != uVar9) {
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::vector(&testBucket,
                     buckets.
                     super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11);
            uVar15 = 0;
            bVar5 = bVar3;
LAB_0011c3c3:
            bVar3 = bVar5;
            if (uVar15 < (ulong)(((long)testBucket.
                                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)testBucket.
                                       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
              std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                        ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)
                         &testSet.
                          super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                         ,testBucket.
                          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar15);
              uVar16 = 0;
              uVar10 = 0;
              uVar14 = 0;
              piVar7 = currentSet.
                       super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                       _M_impl.super__Vector_impl_data._M_start;
LAB_0011c403:
              do {
                if ((ulong)((long)currentSet.
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 3) <=
                    uVar16) goto LAB_0011c4a0;
                for (uVar14 = (ulong)(int)uVar14;
                    uVar14 < (ulong)((long)testSet.
                                           super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)testSet.
                                           super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3);
                    uVar14 = uVar14 + 1) {
                  bVar5 = operator<(piVar7 + uVar16,
                                    testSet.
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar14);
                  if (bVar5) goto LAB_0011c4a0;
                  iVar19 = -(uint)(testSet.
                                   super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].first ==
                                  currentSet.
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].first);
                  iVar20 = -(uint)(testSet.
                                   super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].second ==
                                  currentSet.
                                  super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].second);
                  auVar18._4_4_ = iVar19;
                  auVar18._0_4_ = iVar19;
                  auVar18._8_4_ = iVar20;
                  auVar18._12_4_ = iVar20;
                  iVar19 = movmskpd(extraout_EDX,auVar18);
                  piVar7 = currentSet.
                           super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (iVar19 == 3) {
                    uVar10 = (ulong)((int)uVar10 + 1);
                    uVar16 = uVar16 + 1;
                    if ((long)currentSet.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)currentSet.
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3 != uVar10)
                    goto LAB_0011c403;
                    bVar3 = false;
                    goto LAB_0011c4a0;
                  }
                }
                uVar16 = uVar16 + 1;
              } while( true );
            }
            goto LAB_0011c4bc;
          }
          goto LAB_0011c4e8;
        }
        goto LAB_0011c505;
      }
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector(&newbucked);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         output.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         output.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         output.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    output.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    output.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    output.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::~vector(&bucket);
  }
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&vectors);
  std::
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ::~vector(&buckets);
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&output);
  return __return_storage_ptr__;
LAB_0011c4a0:
  std::_Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::~_Vector_base
            (&testSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>);
  uVar15 = uVar15 + 1;
  bVar5 = bVar3;
  if (!bVar3) goto code_r0x0011c4b5;
  goto LAB_0011c3c3;
code_r0x0011c4b5:
  bVar5 = false;
LAB_0011c4bc:
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector(&testBucket);
  uVar11 = uVar11 + 1;
  if (!bVar5) goto LAB_0011c4e8;
  goto LAB_0011c39e;
LAB_0011c4e8:
  if (bVar3) {
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::push_back(&output,&currentSet);
  }
LAB_0011c505:
  std::_Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::~_Vector_base
            (&currentSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
            );
  uVar17 = uVar17 + 1;
  goto LAB_0011c350;
}

Assistant:

std::vector<std::vector<int_pair>> find_maximal_subsets_of_pairs(std::vector<std::set<int_pair>> sets)
    {
        std::vector<std::vector<int_pair>> output;
        std::vector<std::vector<std::vector<int_pair>>> buckets;

        // transform sets into vectors:
        std::vector<std::vector<int_pair>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int_pair> vec;
            for (std::set<int_pair>::iterator j = sets[i].begin(); j != sets[i].end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        if (vectors.size() <= 1)
        { return vectors; }

        // sort the vector by descending length
        std::sort(vectors.begin(), vectors.end(),
                  [](std::vector<int_pair> x, std::vector<int_pair> y) -> int { return (x.size() > y.size()); });


        int length = vectors[0].size();
        std::vector<std::vector<int_pair>> bucket;//current bucket
        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                std::vector<std::vector<int_pair>> newbucked;
                bucket = newbucked;
                bucket.push_back(vectors[i]);
            }
        }
        buckets.push_back(bucket);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            output.push_back(buckets[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int_pair>> currentBucket = buckets[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int_pair> currentSet = currentBucket[a]; // this set can be potentially added


                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int_pair>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int_pair> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    if (testMatches == currentSet.size())
                                    {
                                        // SAME LENGTH
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet); }
            }//a
        }//i


        return output;
    }